

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O2

bool MeCab::anon_unknown_23::is_valid_node<mecab_node_t>(Lattice *lattice,mecab_node_t *node)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *pcVar8;
  char *__dest;
  char **ppcVar9;
  char **ppcVar10;
  size_t sVar11;
  size_t sVar12;
  size_t i;
  ulong uVar13;
  ulong uVar14;
  scoped_fixed_array<char_*,_64> local_90;
  scoped_fixed_array<char_*,_64> c1;
  scoped_fixed_array<char,_8192> buf2;
  scoped_fixed_array<char,_8192> buf1;
  char *__src;
  
  pcVar4 = node->surface;
  iVar5 = (*lattice->_vptr_Lattice[8])();
  uVar1 = node->length;
  iVar6 = (*lattice->_vptr_Lattice[0x1f])
                    (lattice,pcVar4 + ((ulong)uVar1 - CONCAT44(extraout_var,iVar5)));
  if (iVar6 != 2) {
    pcVar8 = node->surface;
    iVar6 = (*lattice->_vptr_Lattice[8])(lattice);
    uVar2 = node->length;
    uVar3 = node->rlength;
    iVar7 = (*lattice->_vptr_Lattice[0x20])
                      (lattice,pcVar8 + ((ulong)uVar2 -
                                        ((ulong)uVar3 + CONCAT44(extraout_var_00,iVar6))));
    __src = (char *)CONCAT44(extraout_var_01,iVar7);
    if (__src == (char *)0x0) {
      return true;
    }
    iVar6 = (*lattice->_vptr_Lattice[0x1f])
                      (lattice,pcVar8 + ((ulong)uVar2 -
                                        ((ulong)uVar3 + CONCAT44(extraout_var_00,iVar6))));
    if ((iVar6 == 1) &&
       (iVar5 = (*lattice->_vptr_Lattice[0x1f])
                          (lattice,pcVar4 + ((ulong)uVar1 - CONCAT44(extraout_var,iVar5))),
       iVar5 == 1)) {
      pcVar4 = node->feature;
      if ((*__src == '*') && (__src[1] == '\0')) {
        return true;
      }
      buf1._vptr_scoped_fixed_array = (_func_int **)&PTR__scoped_fixed_array_0019ed28;
      pcVar8 = (char *)operator_new__(0x2000);
      buf1.size_ = 0x2000;
      buf2._vptr_scoped_fixed_array = (_func_int **)&PTR__scoped_fixed_array_0019ed28;
      buf1.ptr_ = pcVar8;
      __dest = (char *)operator_new__(0x2000);
      buf2.size_ = 0x2000;
      c1._vptr_scoped_fixed_array = (_func_int **)&PTR__scoped_fixed_array_0019eee0;
      buf2.ptr_ = __dest;
      ppcVar9 = (char **)operator_new__(0x200);
      c1.size_ = 0x40;
      local_90._vptr_scoped_fixed_array = (_func_int **)&PTR__scoped_fixed_array_0019eee0;
      c1.ptr_ = ppcVar9;
      ppcVar10 = (char **)operator_new__(0x200);
      local_90.size_ = 0x40;
      local_90.ptr_ = ppcVar10;
      strncpy(pcVar8,__src,0x2000);
      strncpy(__dest,pcVar4,0x2000);
      sVar11 = tokenizeCSV<char**>(pcVar8,ppcVar9,0x40);
      sVar12 = tokenizeCSV<char**>(buf2.ptr_,ppcVar10,0x40);
      ppcVar10 = c1.ptr_;
      ppcVar9 = local_90.ptr_;
      if (sVar12 < sVar11) {
        sVar11 = sVar12;
      }
      uVar13 = 0;
      while ((uVar14 = sVar11, sVar11 != uVar13 &&
             (((pcVar4 = ppcVar10[uVar13], *pcVar4 == '*' && (pcVar4[1] == '\0')) ||
              (iVar5 = strcmp(pcVar4,ppcVar9[uVar13]), uVar14 = uVar13, iVar5 == 0))))) {
        uVar13 = uVar13 + 1;
      }
      scoped_fixed_array<char_*,_64>::~scoped_fixed_array(&local_90);
      scoped_fixed_array<char_*,_64>::~scoped_fixed_array(&c1);
      scoped_fixed_array<char,_8192>::~scoped_fixed_array(&buf2);
      scoped_fixed_array<char,_8192>::~scoped_fixed_array(&buf1);
      if (sVar11 <= uVar14) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool is_valid_node(const Lattice *lattice,  N *node) {
  const size_t end_pos = node->surface - lattice->sentence() + node->length;
  if (lattice->boundary_constraint(end_pos) == MECAB_INSIDE_TOKEN) {
    return false;
  }
  const size_t begin_pos =
      node->surface - lattice->sentence() + node->length - node->rlength;
  const char *feature = lattice->feature_constraint(begin_pos);
  if (!feature) {
    return true;
  }
  if (lattice->boundary_constraint(begin_pos) == MECAB_TOKEN_BOUNDARY &&
      lattice->boundary_constraint(end_pos) == MECAB_TOKEN_BOUNDARY &&
      partial_match(feature, node->feature)) {
    return true;
  }
  return false;
}